

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

bool __thiscall Omega_h::InputScalar::as(InputScalar *this,int *out)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  void *this_00;
  long local_1a8;
  LL val;
  istringstream ss;
  int *out_local;
  InputScalar *this_local;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&val,(string *)&this->str,_S_in);
  this_00 = (void *)std::istream::operator>>((istringstream *)&val,std::noskipws);
  std::istream::operator>>(this_00,&local_1a8);
  bVar3 = std::ios::eof();
  if (((((bVar3 & 1) == 0) || (bVar3 = std::ios::fail(), lVar1 = local_1a8, (bVar3 & 1) != 0)) ||
      (iVar4 = std::numeric_limits<int>::min(), lVar2 = local_1a8, lVar1 < iVar4)) ||
     (iVar4 = std::numeric_limits<int>::max(), iVar4 < lVar2)) {
    this_local._7_1_ = false;
  }
  else {
    *out = (int)local_1a8;
    this_local._7_1_ = true;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&val);
  return this_local._7_1_;
}

Assistant:

bool InputScalar::as(int& out) const {
  std::istringstream ss(str);
  using LL = long long;
  LL val;
  ss >> std::noskipws >> val;
  if (ss.eof() && !ss.fail() && (val >= LL(std::numeric_limits<int>::min())) &&
      (val <= LL(std::numeric_limits<int>::max()))) {
    out = int(val);
    return true;
  }
  return false;
}